

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_Delete(cJSON *item)

{
  cJSON *pcVar1;
  uint uVar2;
  
  while (item != (cJSON *)0x0) {
    pcVar1 = item->next;
    uVar2 = item->type;
    if (((uVar2 >> 8 & 1) == 0) && (item->child != (cJSON *)0x0)) {
      cJSON_Delete(item->child);
      uVar2 = item->type;
    }
    if (((uVar2 >> 8 & 1) == 0) && (item->valuestring != (char *)0x0)) {
      (*global_hooks.deallocate)(item->valuestring);
      uVar2 = item->type;
    }
    if (((uVar2 >> 9 & 1) == 0) && (item->string != (char *)0x0)) {
      (*global_hooks.deallocate)(item->string);
    }
    (*global_hooks.deallocate)(item);
    item = pcVar1;
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Delete(cJSON *item)
{
    cJSON *next = NULL;
    while (item != NULL)
    {
        next = item->next;
        if (!(item->type & cJSON_IsReference) && (item->child != NULL))
        {
            cJSON_Delete(item->child);
        }
        if (!(item->type & cJSON_IsReference) && (item->valuestring != NULL))
        {
            global_hooks.deallocate(item->valuestring);
        }
        if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
        {
            global_hooks.deallocate(item->string);
        }
        global_hooks.deallocate(item);
        item = next;
    }
}